

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

void __thiscall cinatra::coro_http_client::construct_proxy_uri(coro_http_client *this,uri_t *u)

{
  bool bVar1;
  uri_t *this_00;
  long in_RSI;
  __sv_type _Var2;
  char *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  uri_t *in_stack_fffffffffffffe98;
  uri_t *in_stack_fffffffffffffea8;
  size_t local_110;
  char *local_108;
  uri_t *in_stack_ffffffffffffff08;
  
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x161a33);
  if ((!bVar1) &&
     (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x161a4f), !bVar1)) {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x161a6b
                      );
    if (!bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x161a83);
    }
    uri_t::get_port_abi_cxx11_(in_stack_ffffffffffffff08);
    bVar1 = std::operator==(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::__cxx11::string::~string(in_stack_fffffffffffffe70);
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
      uri_t::get_host_abi_cxx11_(in_stack_fffffffffffffe98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
      std::__cxx11::string::~string(in_stack_fffffffffffffe70);
    }
    else {
      uri_t::get_port_abi_cxx11_(in_stack_ffffffffffffff08);
      bVar1 = std::operator==(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      std::__cxx11::string::~string(in_stack_fffffffffffffe70);
      if (bVar1) {
        this_00 = (uri_t *)std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
        uri_t::get_host_abi_cxx11_(this_00);
        in_stack_fffffffffffffea8 =
             (uri_t *)std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
        std::__cxx11::string::~string(in_stack_fffffffffffffe70);
      }
      else {
        in_stack_fffffffffffffe80 =
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
        uri_t::get_host_abi_cxx11_(in_stack_fffffffffffffe98);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        in_stack_fffffffffffffe78 =
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
        uri_t::get_port_abi_cxx11_(in_stack_ffffffffffffff08);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        std::__cxx11::string::~string(in_stack_fffffffffffffe70);
        std::__cxx11::string::~string(in_stack_fffffffffffffe70);
      }
    }
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xffffffffffffff00;
    uri_t::get_path_abi_cxx11_(in_stack_fffffffffffffea8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    std::__cxx11::string::~string(this_01);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(this_01);
    local_110 = _Var2._M_len;
    *(size_t *)(in_RSI + 0x40) = local_110;
    local_108 = _Var2._M_str;
    *(char **)(in_RSI + 0x48) = local_108;
  }
  return;
}

Assistant:

void construct_proxy_uri(uri_t &u) {
    if (!proxy_host_.empty() && !proxy_port_.empty()) {
      if (!proxy_request_uri_.empty())
        proxy_request_uri_.clear();
      if (u.get_port() == "80") {
        proxy_request_uri_.append("http://").append(u.get_host()).append(":80");
      }
      else if (u.get_port() == "443") {
        proxy_request_uri_.append("https://")
            .append(u.get_host())
            .append(":443");
      }
      else {
        // all be http
        proxy_request_uri_.append("http://")
            .append(u.get_host())
            .append(":")
            .append(u.get_port());
      }
      proxy_request_uri_.append(u.get_path());
      u.path = std::string_view(proxy_request_uri_);
    }
  }